

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

void mnist_model_save(mnist_model *model,string *fname)

{
  ggml_tensor *pgVar1;
  undefined8 uVar2;
  pointer ppgVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  pointer ppgVar9;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> weights;
  _Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> local_88;
  string *local_70;
  ggml_tensor *local_68;
  ggml_tensor *pgStack_60;
  ggml_tensor *local_58;
  ggml_tensor *pgStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  printf("%s: saving model to \'%s\'\n","mnist_model_save",(fname->_M_dataplus)._M_p);
  uVar5 = ggml_init();
  uVar6 = gguf_init_empty();
  gguf_set_val_str(uVar6,"general.architecture",(model->arch)._M_dataplus._M_p);
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = std::operator==(&model->arch,"mnist-fc");
  local_70 = fname;
  if (bVar4) {
    local_68 = model->fc1_weight;
    pgStack_60 = model->fc1_bias;
    local_58 = model->fc2_weight;
    pgStack_50 = model->fc2_bias;
    std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_assign_aux<ggml_tensor*const*>
              ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)&local_88,&local_68);
    ppgVar9 = local_88._M_impl.super__Vector_impl_data._M_start;
    ppgVar3 = local_88._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar4 = std::operator==(&model->arch,"mnist-cnn");
    if (!bVar4) {
      uVar5 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                         ,0x1b3,"GGML_ASSERT(%s) failed","false");
      std::_Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::~_Vector_base(&local_88);
      _Unwind_Resume(uVar5);
    }
    local_68 = model->conv1_kernel;
    pgStack_60 = model->conv1_bias;
    local_58 = model->conv2_kernel;
    pgStack_50 = model->conv2_bias;
    local_48 = *(undefined4 *)&model->dense_weight;
    uStack_44 = *(undefined4 *)((long)&model->dense_weight + 4);
    uStack_40 = *(undefined4 *)&model->dense_bias;
    uStack_3c = *(undefined4 *)((long)&model->dense_bias + 4);
    std::vector<ggml_tensor*,std::allocator<ggml_tensor*>>::_M_assign_aux<ggml_tensor*const*>
              ((vector<ggml_tensor*,std::allocator<ggml_tensor*>> *)&local_88,&local_68);
    ppgVar9 = local_88._M_impl.super__Vector_impl_data._M_start;
    ppgVar3 = local_88._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppgVar9 != ppgVar3; ppgVar9 = ppgVar9 + 1) {
    pgVar1 = *ppgVar9;
    lVar7 = ggml_dup_tensor(uVar5,pgVar1);
    ggml_set_name(lVar7,pgVar1->name);
    uVar2 = *(undefined8 *)(lVar7 + 0xf8);
    uVar8 = ggml_nbytes(pgVar1);
    ggml_backend_tensor_get(pgVar1,uVar2,0,uVar8);
    gguf_add_tensor(uVar6,lVar7);
  }
  gguf_write_to_file(uVar6,(local_70->_M_dataplus)._M_p,0);
  ggml_free(uVar5);
  gguf_free(uVar6);
  std::_Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void mnist_model_save(mnist_model & model, const std::string & fname) {
    printf("%s: saving model to '%s'\n", __func__, fname.c_str());

    struct ggml_context * ggml_ctx;
    {
        struct ggml_init_params params = {
            /*.mem_size   =*/ 100 * 1024*1024,
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ false,
        };
        ggml_ctx = ggml_init(params);
    }

    gguf_context * gguf_ctx = gguf_init_empty();
    gguf_set_val_str(gguf_ctx, "general.architecture", model.arch.c_str());

    std::vector<struct ggml_tensor *> weights;
    if (model.arch == "mnist-fc") {
        weights = {model.fc1_weight, model.fc1_bias, model.fc2_weight, model.fc2_bias};
    } else if (model.arch == "mnist-cnn") {
        weights = {model.conv1_kernel, model.conv1_bias, model.conv2_kernel, model.conv2_bias, model.dense_weight, model.dense_bias};
    } else {
        GGML_ASSERT(false);
    }
    for (struct ggml_tensor * t : weights) {
        struct ggml_tensor * copy = ggml_dup_tensor(ggml_ctx, t);
        ggml_set_name(copy, t->name);
        ggml_backend_tensor_get(t, copy->data, 0, ggml_nbytes(t));
        gguf_add_tensor(gguf_ctx, copy);
    }
    gguf_write_to_file(gguf_ctx, fname.c_str(), false);

    ggml_free(ggml_ctx);
    gguf_free(gguf_ctx);
}